

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall
HighsSymmetryDetection::cleanupBacktrack(HighsSymmetryDetection *this,HighsInt cellCreationStackPos)

{
  HighsInt pos;
  int iVar1;
  HighsInt cell;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((long)(this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  while( true ) {
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < cellCreationStackPos) break;
    pos = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar3];
    cell = getCellStart(this,pos);
    iVar1 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[cell];
    lVar2 = (long)pos;
    while ((lVar2 < iVar1 &&
           ((this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar2]] == pos))) {
      updateCellMembership(this,(HighsInt)lVar2,cell,false);
      lVar2 = lVar2 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->cellCreationStack,(long)cellCreationStackPos);
  return;
}

Assistant:

void HighsSymmetryDetection::cleanupBacktrack(HighsInt cellCreationStackPos) {
  // the links have been updated. Even though they might still not be fully
  // compressed the cell starts will all point to the correct cell end and the
  // lookup with path compression will give the correct start
  for (HighsInt stackPos = cellCreationStack.size() - 1;
       stackPos >= cellCreationStackPos; --stackPos) {
    HighsInt cell = cellCreationStack[stackPos];

    HighsInt cellStart = getCellStart(cell);
    HighsInt cellEnd = currentPartitionLinks[cellStart];

    for (HighsInt v = cell;
         v < cellEnd && vertexToCell[currentPartition[v]] == cell; ++v)
      updateCellMembership(v, cellStart, false);
  }

  cellCreationStack.resize(cellCreationStackPos);
}